

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

Integer pnga_read_inc(Integer g_a,Integer *subscript,Integer inc)

{
  global_array_t *pgVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  C_Integer *pCVar5;
  Integer IVar6;
  ushort uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  C_Integer CVar11;
  long lVar12;
  Integer _d;
  global_array_t *pgVar13;
  long *ploc;
  ushort uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  void *prem;
  bool bVar22;
  Integer proc;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long lvalue;
  long local_1d0 [7];
  Integer local_198;
  long local_190;
  int ivalue;
  undefined4 uStack_184;
  Integer local_148;
  long local_140;
  Integer ldp [7];
  
  lVar15 = g_a + 1000;
  local_148 = inc;
  if ((g_a < -1000) || (_max_global_array <= lVar15)) {
    sprintf((char *)ldp,"%s: INVALID ARRAY HANDLE","nga_read_inc");
    pnga_error((char *)ldp,g_a);
  }
  lVar20 = lVar15 * 0x368;
  if (GA[lVar15].actv == 0) {
    sprintf((char *)ldp,"%s: ARRAY NOT ACTIVE","nga_read_inc");
    pnga_error((char *)ldp,g_a);
  }
  uVar8 = GA[lVar15].type - 0x3e9;
  if ((0xf < uVar8) || ((0x8003U >> (uVar8 & 0x1f) & 1) == 0)) {
    pnga_error("type must be integer",(long)GA[lVar15].type);
  }
  GAstat.numrdi = GAstat.numrdi + 1;
  GAbytes.rditot = GAbytes.rditot + 8.0;
  local_1e0 = (long)GA[lVar15].p_handle;
  lVar21 = (long)GA[lVar15].ndim;
  pnga_locate(g_a,subscript,&proc);
  local_198 = g_a;
  local_1f0 = lVar20;
  if (GA[lVar15].distr_type != 0) {
    lVar12 = 1;
    pnga_distribution(g_a,proc,&lvalue,(Integer *)&ivalue);
    pnga_access_block_ptr(g_a,proc,&local_140,ldp);
    lVar10 = 0;
    lVar17 = lVar21 + -1;
    if (lVar21 + -1 < 1) {
      lVar17 = lVar10;
    }
    lVar9 = 0;
    for (; lVar17 != lVar10; lVar10 = lVar10 + 1) {
      lVar9 = lVar9 + (subscript[lVar10] - local_1d0[lVar10 + -1]) * lVar12;
      lVar12 = lVar12 * ldp[lVar10];
    }
    prem = (void *)((long)GA[lVar15].elemsize *
                    ((subscript[lVar21 + -1] - (&local_1e0)[lVar21]) * lVar12 + lVar9) + local_140);
    pgVar13 = GA;
    goto LAB_0016eaae;
  }
  pgVar1 = GA + lVar15;
  uVar14 = pgVar1->ndim;
  local_1e8 = (long)(short)uVar14;
  pgVar13 = GA;
  if (pgVar1->num_rstrctd == 0) {
    lVar20 = 0;
    lVar15 = 0;
    if (0 < local_1e8) {
      lVar15 = local_1e8;
    }
    local_190 = g_a * 0x368;
    lVar12 = 1;
    for (; lVar15 != lVar20; lVar20 = lVar20 + 1) {
      lVar12 = lVar12 * GA[g_a + 1000].nblock[lVar20];
    }
    if (proc < lVar12 && -1 < proc) {
      lVar20 = 0;
      IVar6 = proc;
      for (lVar12 = 0; lVar15 != lVar12; lVar12 = lVar12 + 1) {
        lVar10 = (long)GA[g_a + 1000].nblock[lVar12];
        lVar17 = IVar6 % lVar10;
        pCVar5 = pgVar1->mapc;
        local_1d0[lVar12 + -1] = pCVar5[lVar17 + lVar20];
        if (lVar17 == lVar10 + -1) {
          CVar11 = GA[g_a + 1000].dims[lVar12];
        }
        else {
          CVar11 = pCVar5[lVar17 + lVar20 + 1] + -1;
        }
        lVar20 = lVar20 + lVar10;
        *(C_Integer *)(&ivalue + lVar12 * 2) = CVar11;
        IVar6 = IVar6 / lVar10;
      }
    }
    else {
      for (lVar20 = 0; lVar15 != lVar20; lVar20 = lVar20 + 1) {
        local_1d0[lVar20 + -1] = 0;
        (&ivalue + lVar20 * 2)[0] = -1;
        (&ivalue + lVar20 * 2)[1] = -1;
      }
    }
    lVar15 = local_1e8 + -1;
    for (lVar20 = 0; lVar20 < (short)uVar14; lVar20 = lVar20 + 1) {
      if (*(long *)(&ivalue + lVar20 * 2) < subscript[lVar20] ||
          subscript[lVar20] < local_1d0[lVar20 + -1]) {
        sprintf((char *)ldp,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
        pnga_error((char *)ldp,lVar20);
        uVar14 = *(ushort *)((long)GA->dims + local_1f0 + -0x30);
        pgVar13 = GA;
      }
    }
    lVar20 = (long)pgVar13->dims + local_1f0 + -0x30;
    if (lVar15 == 0) {
      ldp[0] = (CONCAT44(uStack_184,ivalue) - lvalue) + *(long *)(lVar20 + 0xc0) * 2 + 1;
    }
    lVar12 = 0;
    if (lVar15 < 1) {
      lVar15 = lVar12;
    }
    lVar17 = 1;
    lVar10 = 0;
    for (; lVar15 != lVar12; lVar12 = lVar12 + 1) {
      lVar9 = *(long *)((long)pgVar13[1000].width + lVar12 * 8 + local_190);
      lVar19 = ((lVar9 * 2 + 1) - local_1d0[lVar12 + -1]) + *(long *)(&ivalue + lVar12 * 2);
      lVar10 = lVar10 + ((lVar9 + subscript[lVar12]) - local_1d0[lVar12 + -1]) * lVar17;
      ldp[lVar12] = lVar19;
      lVar17 = lVar17 * lVar19;
    }
    lVar10 = ((subscript[local_1e8 + -1] - (&local_1e0)[local_1e8]) +
             *(long *)(lVar20 + 0xb8 + local_1e8 * 8)) * lVar17 + lVar10;
    if (*(int *)(lVar20 + 0x210) == 0) {
      lVar15 = (long)PGRP_LIST->inv_map_proc_list[proc];
    }
    else {
      lVar15 = proc;
      if (*(long *)(lVar20 + 0x2a8) != 0) {
        lVar15 = *(long *)(lVar20 + 0x2a0);
        goto LAB_0016ea72;
      }
    }
  }
  else {
    lVar15 = pgVar1->rank_rstrctd[proc];
    if (lVar15 < pgVar1->num_rstrctd) {
      lVar12 = 0;
      lVar20 = 0;
      if (0 < local_1e8) {
        lVar20 = local_1e8;
      }
      lVar17 = 1;
      for (; lVar20 != lVar12; lVar12 = lVar12 + 1) {
        lVar17 = lVar17 * GA[g_a + 1000].nblock[lVar12];
      }
      if (lVar15 < lVar17 && -1 < lVar15) {
        lVar17 = 0;
        for (lVar12 = 0; lVar20 != lVar12; lVar12 = lVar12 + 1) {
          lVar9 = (long)GA[g_a + 1000].nblock[lVar12];
          lVar10 = lVar15 % lVar9;
          pCVar5 = pgVar1->mapc;
          local_1d0[lVar12 + -1] = pCVar5[lVar10 + lVar17];
          if (lVar10 == lVar9 + -1) {
            CVar11 = GA[g_a + 1000].dims[lVar12];
          }
          else {
            CVar11 = pCVar5[lVar10 + lVar17 + 1] + -1;
          }
          lVar17 = lVar17 + lVar9;
          *(C_Integer *)(&ivalue + lVar12 * 2) = CVar11;
          lVar15 = lVar15 / lVar9;
        }
      }
      else {
        for (lVar15 = 0; lVar20 != lVar15; lVar15 = lVar15 + 1) {
          local_1d0[lVar15 + -1] = 0;
          (&ivalue + lVar15 * 2)[0] = -1;
          (&ivalue + lVar15 * 2)[1] = -1;
        }
      }
    }
    else {
      uVar16 = 0;
      uVar7 = 0;
      if (0 < (short)uVar14) {
        uVar7 = uVar14;
      }
      for (; uVar7 != uVar16; uVar16 = uVar16 + 1) {
        local_1d0[uVar16 - 1] = 0;
        (&ivalue + uVar16 * 2)[0] = -1;
        (&ivalue + uVar16 * 2)[1] = -1;
      }
    }
    lVar15 = local_1e8 + -1;
    for (lVar20 = 0; lVar20 < (short)uVar14; lVar20 = lVar20 + 1) {
      if (*(long *)(&ivalue + lVar20 * 2) < subscript[lVar20] ||
          subscript[lVar20] < local_1d0[lVar20 + -1]) {
        sprintf((char *)ldp,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
        pnga_error((char *)ldp,lVar20);
        uVar14 = *(ushort *)((long)GA->dims + local_1f0 + -0x30);
        pgVar13 = GA;
      }
    }
    lVar20 = (long)pgVar13->dims + local_1f0 + -0x30;
    if (lVar15 == 0) {
      ldp[0] = (CONCAT44(uStack_184,ivalue) - lvalue) + *(long *)(lVar20 + 0xc0) * 2 + 1;
    }
    lVar10 = 0;
    if (lVar15 < 1) {
      lVar15 = lVar10;
    }
    lVar12 = 1;
    for (lVar17 = 0; lVar15 != lVar17; lVar17 = lVar17 + 1) {
      lVar9 = ((pgVar13[local_198 + 1000].width[lVar17] * 2 + 1) - local_1d0[lVar17 + -1]) +
              *(long *)(&ivalue + lVar17 * 2);
      lVar10 = lVar10 + ((pgVar13[local_198 + 1000].width[lVar17] + subscript[lVar17]) -
                        local_1d0[lVar17 + -1]) * lVar12;
      ldp[lVar17] = lVar9;
      lVar12 = lVar12 * lVar9;
    }
    lVar10 = ((subscript[local_1e8 + -1] - (&local_1e0)[local_1e8]) +
             *(long *)(lVar20 + 0xb8 + local_1e8 * 8)) * lVar12 + lVar10;
    if (*(int *)(lVar20 + 0x210) == 0) {
      lVar15 = (long)PGRP_LIST->inv_map_proc_list[*(long *)(*(long *)(lVar20 + 0x2c0) + proc * 8)];
    }
    else if (*(long *)(lVar20 + 0x2a8) == 0) {
      lVar15 = *(long *)(lVar20 + 0x2c0);
LAB_0016ea72:
      lVar15 = *(long *)(lVar15 + proc * 8);
    }
    else {
      lVar15 = *(long *)(*(long *)(lVar20 + 0x2a0) +
                        *(long *)(*(long *)(lVar20 + 0x2c0) + proc * 8) * 8);
    }
  }
  prem = (void *)(lVar10 * *(int *)(lVar20 + 0x18) +
                 *(long *)(*(long *)(lVar20 + 0x1e0) + lVar15 * 8));
  lVar20 = local_1f0;
LAB_0016eaae:
  IVar6 = local_198;
  iVar3 = *(int *)((long)pgVar13->dims + lVar20 + -0x2c);
  if (GAme == proc) {
    GAbytes.rdiloc = GAbytes.rdiloc + 8.0;
  }
  iVar4 = *(int *)((long)pgVar13->block_dims + local_1f0 + -4);
  if (iVar4 - 3U < 2) {
    sVar2 = *(short *)((long)pgVar13->dims + local_1f0 + -0x30);
    uVar8 = (uint)sVar2;
    lVar20 = (long)(int)proc % *(long *)((long)pgVar13->num_blocks + local_1f0);
    lvalue = lVar20;
    lVar15 = 0;
    while (lVar15 + 1 < (long)(int)uVar8) {
      proc = ((int)proc - lVar20) / pgVar13[IVar6 + 1000].num_blocks[lVar15];
      lVar20 = (long)(int)proc % pgVar13[IVar6 + 1000].num_blocks[lVar15 + 1];
      local_1d0[lVar15] = lVar20;
      lVar15 = lVar15 + 1;
    }
    lVar15 = 0;
    if (lVar21 < 1) {
      lVar21 = lVar15;
    }
    for (; lVar21 != lVar15; lVar15 = lVar15 + 1) {
      local_1d0[lVar15 + -1] = local_1d0[lVar15 + -1] % (long)pgVar13[IVar6 + 1000].nblock[lVar15];
    }
    uVar16 = 0;
    uVar18 = 0;
    if (0 < sVar2) {
      uVar18 = (ulong)uVar8;
    }
    for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
      *(long *)(&ivalue + uVar16 * 2) =
           local_1d0[uVar16 - 1] % (long)pgVar13[IVar6 + 1000].nblock[uVar16];
    }
    proc = (&local_190)[(int)uVar8];
    for (uVar8 = uVar8 - 2; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      proc = proc * *(int *)((long)pgVar13->nblock + (ulong)uVar8 * 4 + local_1f0) +
             *(long *)(&ivalue + (ulong)uVar8 * 2);
    }
  }
  else if (iVar4 == 2) {
    sVar2 = *(short *)((long)pgVar13->dims + local_1f0 + -0x30);
    uVar8 = (uint)sVar2;
    lVar20 = (long)(int)proc % *(long *)((long)pgVar13->num_blocks + local_1f0);
    lvalue = lVar20;
    lVar15 = 0;
    while (lVar15 + 1 < (long)(int)uVar8) {
      proc = ((int)proc - lVar20) / pgVar13[IVar6 + 1000].num_blocks[lVar15];
      lVar20 = (long)(int)proc % pgVar13[IVar6 + 1000].num_blocks[lVar15 + 1];
      local_1d0[lVar15] = lVar20;
      lVar15 = lVar15 + 1;
    }
    lVar15 = 0;
    if (lVar21 < 1) {
      lVar21 = lVar15;
    }
    for (; lVar21 != lVar15; lVar15 = lVar15 + 1) {
      local_1d0[lVar15 + -1] = local_1d0[lVar15 + -1] % (long)pgVar13[IVar6 + 1000].nblock[lVar15];
    }
    uVar16 = 0;
    uVar18 = 0;
    if (0 < sVar2) {
      uVar18 = (ulong)uVar8;
    }
    for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
      *(long *)(&ivalue + uVar16 * 2) =
           local_1d0[uVar16 - 1] % (long)pgVar13[IVar6 + 1000].nblock[uVar16];
    }
    proc = (&local_190)[(int)uVar8];
    for (uVar8 = uVar8 - 2; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      proc = proc * *(int *)((long)pgVar13->nblock + (ulong)uVar8 * 4 + local_1f0) +
             *(long *)(&ivalue + (ulong)uVar8 * 2);
    }
  }
  else if (iVar4 == 1) {
    IVar6 = pnga_nnodes();
    proc = proc % IVar6;
  }
  if ((int)local_1e0 != -1) {
    proc = (Integer)PGRP_LIST[local_1e0].inv_map_proc_list[proc];
  }
  bVar22 = iVar3 == 0x3e9;
  ploc = &lvalue;
  if (bVar22) {
    ploc = (long *)&ivalue;
  }
  ARMCI_Rmw(bVar22 ^ 0xd,ploc,prem,(int)local_148,(int)proc);
  if (*(int *)((long)GA->dims + local_1f0 + -0x2c) == 0x3e9) {
    lvalue = (long)ivalue;
  }
  return lvalue;
}

Assistant:

Integer pnga_read_inc(Integer g_a, Integer* subscript, Integer inc)
{
GA_Internal_Threadsafe_Lock();
char *ptr;
Integer ldp[MAXDIM], proc, handle=GA_OFFSET+g_a, p_handle, ndim;
int optype,ivalue;
long lvalue;
void *pval;

    ga_check_handleM(g_a, "nga_read_inc");
    
    /* BJP printf("p[%d] g_a: %d subscript: %d inc: %d\n",GAme, g_a, subscript[0], inc); */

    if(GA[handle].type!=C_INT && GA[handle].type!=C_LONG &&
       GA[handle].type!=C_LONGLONG)
       pnga_error("type must be integer",GA[handle].type);

    GAstat.numrdi++;
    GAbytes.rditot += (double)sizeof(Integer);
    p_handle = GA[handle].p_handle;
    ndim = GA[handle].ndim;

    /* find out who owns it */
    pnga_locate(g_a, subscript, &proc);

    /* get an address of the g_a(subscript) element */
    if (GA[handle].distr_type == REGULAR) {
      if (GA[handle].num_rstrctd == 0) {
        gam_Location(proc, handle,  subscript, (char**)&ptr, ldp);
      } else {
        gam_Location(GA[handle].rank_rstrctd[proc], handle,  subscript, (char**)&ptr, ldp);
      }
    } else {
      Integer lo[MAXDIM], hi[MAXDIM];
      Integer j, jtot, last, offset;
      pnga_distribution(g_a, proc, lo, hi);
      pnga_access_block_ptr(g_a, proc, (char**)&ptr, ldp);
      pnga_release_block(g_a, proc);
      offset = 0;
      last = ndim - 1;
      jtot = 1;
      for (j=0; j<last; j++) {
        offset += (subscript[j]-lo[j])*jtot;
        jtot *= ldp[j];
      }
      offset += (subscript[last]-lo[last])*jtot;
      ptr += offset*GA[handle].elemsize;
    }

    if(GA[handle].type==C_INT){
       optype = ARMCI_FETCH_AND_ADD;
       pval = &ivalue;
    }else{
       optype = ARMCI_FETCH_AND_ADD_LONG;
       pval = &lvalue;
    }

    if(GAme == proc)GAbytes.rdiloc += (double)sizeof(Integer);

    if (GA[handle].distr_type == BLOCK_CYCLIC) {
      proc = proc%pnga_nnodes();
    } else if (GA[handle].distr_type == SCALAPACK) {
      Integer j, index[MAXDIM];
      gam_find_block_indices(handle, proc, index);
      for (j=0; j<ndim; j++) {
        index[j] = index[j]%GA[handle].nblock[j];
      }
      gam_find_proc_from_sl_indices(handle,proc,index);
    } else if (GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      Integer j, index[MAXDIM];
      gam_find_block_indices(handle, proc, index);
      for (j=0; j<ndim; j++) {
        index[j] = index[j]%GA[handle].nblock[j];
      }
      gam_find_tile_proc_from_indices(handle,proc,index);
    }
    if (p_handle != -1) {   
       proc=PGRP_LIST[p_handle].inv_map_proc_list[proc];
       /*printf("\n%d:proc=%d",GAme,proc);fflush(stdout);*/
    }

    ARMCI_Rmw(optype, pval, (int*)ptr, (int)inc, (int)proc);


   GA_Internal_Threadsafe_Unlock();
   if(GA[handle].type==C_INT)
       return (Integer) ivalue;
   else
       return (Integer) lvalue;
}